

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_repair_after_lazy(roaring_bitmap_t *r)

{
  uint8_t uVar1;
  int iVar2;
  undefined8 in_RAX;
  array_container_t *sc;
  array_container_t *paVar3;
  long lVar4;
  bitset_container_t *bc;
  uint8_t new_type;
  undefined8 uStack_38;
  
  if (0 < (r->high_low_container).size) {
    lVar4 = 0;
    uStack_38 = in_RAX;
    do {
      uVar1 = (r->high_low_container).typecodes[lVar4];
      sc = (array_container_t *)(r->high_low_container).containers[lVar4];
      uStack_38 = CONCAT17(uVar1,(undefined7)uStack_38);
      if (uVar1 == '\x04') {
        sc = (array_container_t *)
             shared_container_extract_copy
                       ((shared_container_t *)sc,(uint8_t *)((long)&uStack_38 + 7));
        uVar1 = uStack_38._7_1_;
      }
      switch(uVar1) {
      case '\x01':
        iVar2 = bitset_container_compute_cardinality((bitset_container_t *)sc);
        sc->cardinality = iVar2;
        if (0x1000 < iVar2) goto switchD_001157d6_caseD_2;
        paVar3 = array_container_from_bitset((bitset_container_t *)sc);
        bitset_container_free((bitset_container_t *)sc);
        uStack_38 = CONCAT17(2,(undefined7)uStack_38);
        break;
      case '\x02':
switchD_001157d6_caseD_2:
        paVar3 = sc;
        break;
      case '\x03':
        paVar3 = (array_container_t *)
                 convert_run_to_efficient_container
                           ((run_container_t *)sc,(uint8_t *)((long)&uStack_38 + 7));
        if (paVar3 != sc) {
          run_container_free((run_container_t *)sc);
        }
        break;
      case '\x04':
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1173,"container_t *container_repair_after_lazy(container_t *, uint8_t *)");
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1175,"container_t *container_repair_after_lazy(container_t *, uint8_t *)");
      }
      (r->high_low_container).containers[lVar4] = paVar3;
      (r->high_low_container).typecodes[lVar4] = uStack_38._7_1_;
      lVar4 = lVar4 + 1;
    } while (lVar4 < (r->high_low_container).size);
  }
  return;
}

Assistant:

void roaring_bitmap_repair_after_lazy(roaring_bitmap_t *r) {
    roaring_array_t *ra = &r->high_low_container;

    for (int i = 0; i < ra->size; ++i) {
        const uint8_t old_type = ra->typecodes[i];
        container_t *old_c = ra->containers[i];
        uint8_t new_type = old_type;
        container_t *new_c = container_repair_after_lazy(old_c, &new_type);
        ra->containers[i] = new_c;
        ra->typecodes[i] = new_type;
    }
}